

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_benchmark.cpp
# Opt level: O1

int main(void)

{
  pointer pbVar1;
  size_type sVar2;
  pointer *__dest;
  size_type *__dest_00;
  long *plVar3;
  ostream *poVar4;
  istream *piVar5;
  int *piVar6;
  undefined8 uVar7;
  long *plVar8;
  ulong *puVar9;
  size_type *psVar10;
  long lVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> output_path;
  AVLTree<int> avlTree;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  size_type __dnew;
  size_type __dnew_1;
  ofstream output_file1;
  ulong *local_730;
  long local_728;
  ulong local_720;
  long lStack_718;
  int local_70c;
  ulong *local_708;
  long local_700;
  ulong local_6f8;
  long lStack_6f0;
  int local_6e4;
  pointer *local_6e0;
  pointer local_6d8;
  pointer local_6d0 [2];
  long *local_6c0 [2];
  long local_6b0 [2];
  pointer local_6a0;
  long *local_698;
  long local_690;
  long local_688;
  long lStack_680;
  AVLTree<int> local_678;
  pointer local_668;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_660;
  undefined1 local_648 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_638;
  undefined1 *local_628 [2];
  undefined1 local_618 [16];
  undefined1 *local_608 [2];
  undefined1 local_5f8 [16];
  undefined1 *local_5e8 [2];
  undefined1 local_5d8 [16];
  undefined1 *local_5c8 [2];
  undefined1 local_5b8 [16];
  undefined1 *local_5a8 [2];
  undefined1 local_598 [16];
  undefined1 *local_588 [2];
  undefined1 local_578 [16];
  undefined1 *local_568 [2];
  undefined1 local_558 [16];
  undefined1 *local_548 [2];
  undefined1 local_538 [16];
  long *local_528 [2];
  long local_518 [28];
  size_type local_438 [4];
  byte abStack_418 [488];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_6e0 = local_6d0;
  local_648._0_8_ = (pointer)0x8b;
  __dest = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_6e0,(ulong)local_648);
  uVar7 = local_648._0_8_;
  local_6d0[0] = (pointer)local_648._0_8_;
  local_6e0 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/Algorithms-and-Data-Structures-2021[P]semester-work-avl-tree-004/dataset/data/insert"
         ,0x8b);
  local_6d8 = (pointer)uVar7;
  *(char *)((long)__dest + uVar7) = '\0';
  psVar10 = (size_type *)(local_648 + 0x10);
  local_438[0] = 0x77;
  local_648._0_8_ = psVar10;
  __dest_00 = (size_type *)std::__cxx11::string::_M_create((ulong *)local_648,(ulong)local_438);
  sVar2 = local_438[0];
  local_638._M_allocated_capacity = local_438[0];
  local_648._0_8_ = __dest_00;
  memcpy(__dest_00,
         "/workspace/llm4binary/github/license_all_cmakelists_25/Algorithms-and-Data-Structures-2021[P]semester-work-avl-tree-004"
         ,0x77);
  local_648._8_8_ = sVar2;
  *(char *)((long)__dest_00 + sVar2) = '\0';
  plVar3 = (long *)std::__cxx11::string::append(local_648);
  local_698 = &local_688;
  plVar8 = plVar3 + 2;
  if ((long *)*plVar3 == plVar8) {
    local_688 = *plVar8;
    lStack_680 = plVar3[3];
  }
  else {
    local_688 = *plVar8;
    local_698 = (long *)*plVar3;
  }
  local_690 = plVar3[1];
  *plVar3 = (long)plVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((size_type *)local_648._0_8_ != psVar10) {
    operator_delete((void *)local_648._0_8_,local_638._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream((ofstream *)&local_230,(string *)&local_698,_S_out);
  std::ofstream::close();
  local_648._0_8_ = psVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"100","");
  local_628[0] = local_618;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"500","");
  local_608[0] = local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"1000","");
  local_5e8[0] = local_5d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"5000","");
  local_5c8[0] = local_5b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"10000","");
  local_5a8[0] = local_598;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a8,"50000","");
  local_588[0] = local_578;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"100000","");
  local_568[0] = local_558;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_568,"500000","");
  local_548[0] = local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"1000000","");
  plVar3 = local_518;
  local_528[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"5000000","");
  __l._M_len = 10;
  __l._M_array = (iterator)local_648;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_660,__l,(allocator_type *)local_438);
  lVar11 = -0x140;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar11 = lVar11 + 0x20;
  } while (lVar11 != 0);
  itis::AVLTree<int>::AVLTree(&local_678);
  local_668 = local_660.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_660.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_660.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_70c = 1;
      local_6a0 = local_660.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      do {
        pbVar1 = local_6a0;
        local_708 = &local_6f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_708,local_6e0,local_6d8 + (long)local_6e0);
        std::__cxx11::string::append((char *)&local_708);
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_708,(ulong)(pbVar1->_M_dataplus)._M_p);
        local_730 = &local_720;
        puVar9 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar9) {
          local_720 = *puVar9;
          lStack_718 = plVar3[3];
        }
        else {
          local_720 = *puVar9;
          local_730 = (ulong *)*plVar3;
        }
        local_728 = plVar3[1];
        *plVar3 = (long)puVar9;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_730);
        local_648._0_8_ = local_648 + 0x10;
        psVar10 = (size_type *)(plVar3 + 2);
        if ((size_type *)*plVar3 == psVar10) {
          local_638._M_allocated_capacity = *psVar10;
          local_638._8_8_ = plVar3[3];
        }
        else {
          local_638._M_allocated_capacity = *psVar10;
          local_648._0_8_ = (size_type *)*plVar3;
        }
        local_648._8_8_ = plVar3[1];
        *plVar3 = (long)psVar10;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::ifstream::ifstream(local_438,(string *)local_648,_S_in);
        if ((undefined1 *)local_648._0_8_ != local_648 + 0x10) {
          operator_delete((void *)local_648._0_8_,local_638._M_allocated_capacity + 1);
        }
        if (local_730 != &local_720) {
          operator_delete(local_730,local_720 + 1);
        }
        if (local_708 != &local_6f8) {
          operator_delete(local_708,local_6f8 + 1);
        }
        local_730 = &local_720;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_730,local_6e0,local_6d8 + (long)local_6e0);
        std::__cxx11::string::append((char *)&local_730);
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_730,(ulong)(pbVar1->_M_dataplus)._M_p);
        local_648._0_8_ = local_648 + 0x10;
        psVar10 = (size_type *)(plVar3 + 2);
        if ((size_type *)*plVar3 == psVar10) {
          local_638._M_allocated_capacity = *psVar10;
          local_638._8_8_ = plVar3[3];
        }
        else {
          local_638._M_allocated_capacity = *psVar10;
          local_648._0_8_ = (size_type *)*plVar3;
        }
        local_648._8_8_ = plVar3[1];
        *plVar3 = (long)psVar10;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_648._0_8_,local_648._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if ((undefined1 *)local_648._0_8_ != local_648 + 0x10) {
          operator_delete((void *)local_648._0_8_,local_638._M_allocated_capacity + 1);
        }
        if (local_730 != &local_720) {
          operator_delete(local_730,local_720 + 1);
        }
        local_6c0[0] = local_6b0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_6c0,local_6e0,local_6d8 + (long)local_6e0);
        std::__cxx11::string::append((char *)local_6c0);
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_6c0,(ulong)(pbVar1->_M_dataplus)._M_p);
        local_708 = &local_6f8;
        puVar9 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar9) {
          local_6f8 = *puVar9;
          lStack_6f0 = plVar3[3];
        }
        else {
          local_6f8 = *puVar9;
          local_708 = (ulong *)*plVar3;
        }
        local_700 = plVar3[1];
        *plVar3 = (long)puVar9;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_708);
        local_730 = &local_720;
        puVar9 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar9) {
          local_720 = *puVar9;
          lStack_718 = plVar3[3];
        }
        else {
          local_720 = *puVar9;
          local_730 = (ulong *)*plVar3;
        }
        local_728 = plVar3[1];
        *plVar3 = (long)puVar9;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::ifstream::ifstream((stringstream *)local_648,(string *)&local_730,_S_in);
        std::ifstream::operator=(local_438,(ifstream *)local_648);
        std::ifstream::~ifstream((stringstream *)local_648);
        if (local_730 != &local_720) {
          operator_delete(local_730,local_720 + 1);
        }
        if (local_708 != &local_6f8) {
          operator_delete(local_708,local_6f8 + 1);
        }
        if (local_6c0[0] != local_6b0) {
          operator_delete(local_6c0[0],local_6b0[0] + 1);
        }
        if ((abStack_418[*(long *)(local_438[0] - 0x18)] & 5) == 0) {
          local_730 = &local_720;
          local_728 = 0;
          local_720 = local_720 & 0xffffffffffffff00;
          while (piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    ((istream *)local_438,(string *)&local_730,','),
                ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)local_648,(string *)&local_730,_S_out|_S_in);
            std::chrono::_V2::system_clock::now();
            puVar9 = local_730;
            piVar6 = __errno_location();
            local_6e4 = *piVar6;
            *piVar6 = 0;
            lVar11 = strtol((char *)puVar9,(char **)&local_708,10);
            if (local_708 == puVar9) {
LAB_0010302d:
              uVar7 = std::__throw_invalid_argument("stoi");
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_660);
              local_230 = _VTT;
              *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
              std::filebuf::~filebuf(local_228);
              std::ios_base::~ios_base(local_138);
              if (local_698 != &local_688) {
                operator_delete(local_698,local_688 + 1);
              }
              if (local_6e0 != local_6d0) {
                operator_delete(local_6e0,(ulong)(local_6d0[0] + 1));
              }
              _Unwind_Resume(uVar7);
            }
            if (((int)lVar11 != lVar11) || (*piVar6 == 0x22)) {
              std::__throw_out_of_range("stoi");
              goto LAB_0010302d;
            }
            if (*piVar6 == 0) {
              *piVar6 = local_6e4;
            }
            itis::AVLTree<int>::insert(&local_678,(int)lVar11);
            std::chrono::_V2::system_clock::now();
            std::__cxx11::stringstream::~stringstream((stringstream *)local_648);
            std::ios_base::~ios_base((ios_base *)local_5c8);
          }
          if (local_730 != &local_720) {
            operator_delete(local_730,local_720 + 1);
          }
        }
        poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        itis::AVLTree<int>::clear(&local_678);
        std::ifstream::close();
        std::fstream::fstream((stringstream *)local_648,(string *)&local_698,_S_app);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)(local_648 + 0x10),(local_6a0->_M_dataplus)._M_p,
                            local_6a0->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_70c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
        poVar4 = std::ostream::_M_insert<long>((long)poVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        std::fstream::close();
        std::fstream::~fstream((stringstream *)local_648);
        std::ifstream::~ifstream(local_438);
        local_70c = local_70c + 1;
      } while (local_70c != 0xb);
      local_660.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_6a0 + 1;
      local_70c = 0xb;
    } while (local_660.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != local_668);
  }
  itis::AVLTree<int>::~AVLTree(&local_678);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_660);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_698 != &local_688) {
    operator_delete(local_698,local_688 + 1);
  }
  if (local_6e0 != local_6d0) {
    operator_delete(local_6e0,(ulong)(local_6d0[0] + 1));
  }
  return 0;
}

Assistant:

int main() {

  // Tip 1: входные аргументы позволяют более гибко контролировать параметры вашей программы
  const auto path = string(kDatasetPath);
  const auto output_path = string(kProjectPath) + "/benchmark/result/insertResults.csv";

  auto output_file1 = ofstream(output_path);
  output_file1.close();
  // работа с набором данных
  vector<string> files = {"100", "500", "1000", "5000", "10000", "50000", "100000", "500000", "1000000", "5000000"};
  AVLTree<int> avlTree;

  for (const string& file : files) {  // Проходим по всем 10 .csv файлам
    for (int i = 1; i < 11; i++) {    // Запускаем замерку времени 10 раз
      auto input_file = ifstream(path + "/" + file + ".csv");
      auto time_diff_insert = chrono::nanoseconds::zero();
      cout << (path + "/" + file) << endl;

      input_file = ifstream(path + "/" + file + ".csv");

      //         здесь находится участок кода, время которого необходимо замерить
      if (input_file) {
        int line_number = 0;
        for (string line; getline(input_file, line, ','); /* ... */) {
          auto ss = stringstream(line);
          const auto time_point_before_insert = chrono::high_resolution_clock::now();
          avlTree.insert(stoi(line));
          const auto time_point_after_insert = chrono::high_resolution_clock::now();
          line_number++;
          time_diff_insert += time_point_after_insert - time_point_before_insert;
        }
      }

      const auto time_elapsed_ns_insert = chrono::duration_cast<chrono::nanoseconds>(time_diff_insert).count();
      cout << time_elapsed_ns_insert << endl;

      avlTree.clear();
      input_file.close();

      //Открываем файл для записи и вносим полученые данные
      auto output_file = fstream(output_path, ios::app);
      output_file << file << "," << i << "," << time_elapsed_ns_insert << endl;
      output_file.close();
    }
  }
  return 0;
}